

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O0

char * duckdb::Terminal::EditNoTTY(void)

{
  int iVar1;
  char *pcVar2;
  int c;
  char *oldval;
  size_t maxlen;
  size_t len;
  char *line;
  size_t local_20;
  size_t local_18;
  char *local_10;
  char *local_8;
  
  local_10 = (char *)0x0;
  local_18 = 0;
  local_20 = 0;
  do {
    pcVar2 = local_10;
    if (local_18 == local_20) {
      if (local_20 == 0) {
        local_20 = 0x10;
      }
      local_20 = local_20 << 1;
      pcVar2 = (char *)realloc(local_10,local_20);
      if (pcVar2 == (char *)0x0) {
        if (local_10 != (char *)0x0) {
          free(local_10);
        }
        return (char *)0x0;
      }
    }
    local_10 = pcVar2;
    iVar1 = fgetc(_stdin);
    if ((iVar1 == -1) || (iVar1 == 10)) {
      if ((iVar1 == -1) && (local_18 == 0)) {
        free(local_10);
        local_8 = (char *)0x0;
      }
      else {
        local_10[local_18] = '\0';
        local_8 = local_10;
      }
      return local_8;
    }
    local_10[local_18] = (char)iVar1;
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

char *Terminal::EditNoTTY() {
	char *line = NULL;
	size_t len = 0, maxlen = 0;

	while (1) {
		if (len == maxlen) {
			if (maxlen == 0)
				maxlen = 16;
			maxlen *= 2;
			char *oldval = line;
			line = (char *)realloc(line, maxlen);
			if (line == NULL) {
				if (oldval)
					free(oldval);
				return NULL;
			}
		}
		int c = fgetc(stdin);
		if (c == EOF || c == '\n') {
			if (c == EOF && len == 0) {
				free(line);
				return NULL;
			} else {
				line[len] = '\0';
				return line;
			}
		} else {
			line[len] = c;
			len++;
		}
	}
}